

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct>::
ConvertToStruct(vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct> *this)

{
  pointer pOVar1;
  pointer this_00;
  OutPointStruct data;
  OutPointStruct OStack_78;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar1 = (this->super_JsonVector<cfd::js::api::json::OutPoint>).
           super_vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
           .
           super__Vector_base<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::js::api::json::OutPoint>).
                 super_vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
                 .
                 super__Vector_base<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1
      ) {
    js::api::json::OutPoint::ConvertToStruct(&OStack_78,this_00);
    std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::
    push_back(__return_storage_ptr__,&OStack_78);
    js::api::OutPointStruct::~OutPointStruct(&OStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }